

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O2

string * typeToString_abi_cxx11_(string *__return_storage_ptr__,HighsVarType type)

{
  allocator *paVar1;
  undefined7 in_register_00000031;
  char *pcVar2;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch(CONCAT71(in_register_00000031,type) & 0xffffffff) {
  case 0:
    pcVar2 = "Continuous";
    paVar1 = &local_9;
    break;
  case 1:
    pcVar2 = "Integer   ";
    paVar1 = &local_a;
    break;
  case 2:
    pcVar2 = "Semi-conts";
    paVar1 = &local_b;
    break;
  case 3:
    pcVar2 = "Semi-int  ";
    paVar1 = &local_c;
    break;
  case 4:
    pcVar2 = "ImpliedInt";
    paVar1 = &local_d;
    break;
  default:
    pcVar2 = "";
    paVar1 = &local_e;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string typeToString(const HighsVarType type) {
  switch (type) {
    case HighsVarType::kContinuous:
      return "Continuous";
    case HighsVarType::kInteger:
      return "Integer   ";
    case HighsVarType::kSemiContinuous:
      return "Semi-conts";
    case HighsVarType::kSemiInteger:
      return "Semi-int  ";
    case HighsVarType::kImplicitInteger:
      return "ImpliedInt";
  }
  return "";
}